

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void av1_highbd_inv_txfm2d_add_universe_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  uint bd_00;
  byte in_CL;
  int in_EDX;
  undefined8 in_RSI;
  uint8_t *in_RDI;
  int32_t *unaff_retaddr;
  undefined2 in_stack_00000010;
  int in_stack_00004864;
  TX_SIZE in_stack_0000486a;
  TX_TYPE in_stack_0000486b;
  int in_stack_0000486c;
  uint16_t *in_stack_00004870;
  int32_t *in_stack_00004878;
  
  _in_stack_00000010 = CONCAT13(tx_type,CONCAT12(tx_size,in_stack_00000010));
  bd_00 = (uint)in_CL;
  if (bd_00 < 9) {
    highbd_inv_txfm2d_add_no_identity_avx2
              (in_stack_00004878,in_stack_00004870,in_stack_0000486c,in_stack_0000486b,
               in_stack_0000486a,in_stack_00004864,bd_00);
  }
  else if (bd_00 - 9 < 7) {
    av1_highbd_inv_txfm2d_add_universe_sse4_1
              (unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(TX_TYPE)((ulong)in_RSI >> 0x18),
               (TX_SIZE)((ulong)in_RSI >> 0x10),in_EDX,_in_stack_00000010);
  }
  return;
}

Assistant:

static void av1_highbd_inv_txfm2d_add_universe_avx2(const int32_t *input,
                                                    uint8_t *output, int stride,
                                                    TX_TYPE tx_type,
                                                    TX_SIZE tx_size, int eob,
                                                    const int bd) {
  switch (tx_type) {
    case DCT_DCT:
    case ADST_DCT:
    case DCT_ADST:
    case ADST_ADST:
    case FLIPADST_DCT:
    case DCT_FLIPADST:
    case FLIPADST_FLIPADST:
    case ADST_FLIPADST:
    case FLIPADST_ADST:
      highbd_inv_txfm2d_add_no_identity_avx2(input, CONVERT_TO_SHORTPTR(output),
                                             stride, tx_type, tx_size, eob, bd);
      break;
    case IDTX:
    case H_DCT:
    case H_ADST:
    case H_FLIPADST:
    case V_DCT:
    case V_ADST:
    case V_FLIPADST:
      av1_highbd_inv_txfm2d_add_universe_sse4_1(input, output, stride, tx_type,
                                                tx_size, eob, bd);
      break;
    default: assert(0); break;
  }
}